

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O3

void VectorTestMain(void)

{
  int iVar1;
  Vector *V;
  long *plVar2;
  long lVar3;
  Vector *V_00;
  Vector *pVVar4;
  uint uVar5;
  ElementType EVar6;
  int iVar7;
  
  V = (Vector *)malloc(0x10);
  V->ArraySize = 10;
  V->VectorLength = 0;
  GetArray(V);
  uVar5 = 0;
  do {
    uVar5 = uVar5 + 10;
    Insert(V,uVar5,0);
  } while (uVar5 < 0x29);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"After initVector:",0x11)
  ;
  printOut(V);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"The node(pos 3) is:",0x13);
  iVar1 = V->VectorLength;
  EVar6 = 0;
  if (3 < (long)iVar1) {
    EVar6 = V->elements[3];
  }
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,EVar6);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"The position of node 30 is:",0x1b);
  iVar7 = -1;
  if (0 < iVar1) {
    lVar3 = 0;
    do {
      if (V->elements[lVar3] == 0x1e) {
        iVar7 = (int)lVar3;
        break;
      }
      lVar3 = lVar3 + 1;
    } while (iVar1 != lVar3);
  }
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar7);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  Remove(V,2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"After removing the node(pos:2),the Vector is:",0x2d);
  printOut(V);
  V_00 = (Vector *)malloc(0x10);
  V_00->ArraySize = 5;
  V_00->VectorLength = 0;
  GetArray(V_00);
  uVar5 = 0xfffffff6;
  do {
    uVar5 = uVar5 + 0x14;
    Insert(V_00,uVar5,0);
  } while (uVar5 < 0x29);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"VectorA is:",0xb);
  printOut(V);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"VectorB is:",0xb);
  printOut(V_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"The Union of VectorA and VectorB is:",0x24);
  pVVar4 = Union(V,V_00);
  printOut(pVVar4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"The Intersection of VectorA and VectorB is:",0x2b);
  pVVar4 = Intersection(V,V_00);
  printOut(pVVar4);
  free(V->elements);
  free(V_00->elements);
  return;
}

Assistant:

void VectorTestMain()
{
    Vector *V = (Vector *)malloc(sizeof(Vector));
    InitVector(V,10);
    for(int i = 10; i <= 50; i+=10)
        Insert(V,i,0);
    cout << "After initVector:";
    printOut(V);
    cout << "The node(pos 3) is:" << GetNode(V,3) << endl;
    cout << "The position of node 30 is:" << Find(V,30) << endl;
    Remove(V,2);
    cout << "After removing the node(pos:2),the Vector is:";
    printOut(V);
    Vector *tmp = (Vector *)malloc(sizeof(Vector));
    InitVector(tmp,5);
    for(int i = 10; i <= 60; i+=20)
        Insert(tmp,i,0);
    cout << "VectorA is:";
    printOut(V);
    cout << "VectorB is:";
    printOut(tmp);
    cout << "The Union of VectorA and VectorB is:";
    printOut(Union(V,tmp));
    cout << "The Intersection of VectorA and VectorB is:";
    printOut(Intersection(V,tmp));
    FreeVector(V);
    FreeVector(tmp);
}